

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerGLSL::is_non_native_row_major_matrix(CompilerGLSL *this,uint32_t id)

{
  Variant *pVVar1;
  bool bVar2;
  ulong uVar3;
  SPIRExpression *pSVar4;
  uint uVar5;
  
  if ((this->backend).native_row_major_matrix == true) {
    uVar5 = 0x81;
    if ((this->options).es != false) {
      uVar5 = 299;
    }
    if (uVar5 < (this->options).version) {
      return false;
    }
  }
  uVar3 = (ulong)id;
  if (uVar3 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) {
    pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
    if (pVVar1[uVar3].type == TypeExpression) {
      pSVar4 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar3);
      return pSVar4->need_transpose;
    }
  }
  bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)id,DecorationRowMajor);
  return bVar2;
}

Assistant:

bool CompilerGLSL::is_non_native_row_major_matrix(uint32_t id)
{
	// Natively supported row-major matrices do not need to be converted.
	// Legacy targets do not support row major.
	if (backend.native_row_major_matrix && !is_legacy())
		return false;

	auto *e = maybe_get<SPIRExpression>(id);
	if (e)
		return e->need_transpose;
	else
		return has_decoration(id, DecorationRowMajor);
}